

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_primitive_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::csharp::PrimitiveFieldGenerator::GenerateSerializationCode
          (PrimitiveFieldGenerator *this,Printer *printer)

{
  io::Printer::Print(printer,&(this->super_FieldGeneratorBase).variables_,
                     "if ($has_property_check$) {\n  output.WriteRawTag($tag_bytes$);\n  output.Write$capitalized_type_name$($property_name$);\n}\n"
                    );
  return;
}

Assistant:

void PrimitiveFieldGenerator::GenerateSerializationCode(io::Printer* printer) {
  printer->Print(
    variables_,
    "if ($has_property_check$) {\n"
    "  output.WriteRawTag($tag_bytes$);\n"
    "  output.Write$capitalized_type_name$($property_name$);\n"
    "}\n");
}